

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::print_material_binding_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,MaterialBinding *mb,uint32_t indent)

{
  bool bVar1;
  value_type *pvVar2;
  value_type *pvVar3;
  _Rb_tree_node_base *p_Var4;
  ordered_dict<tinyusdz::Relationship> *this_00;
  size_t i;
  ulong idx;
  uint32_t in_R9D;
  long lVar5;
  string rel_name;
  Relationship *rel;
  string matb_name;
  string coll_name;
  stringstream ss;
  allocator local_2c1;
  _Rb_tree_node_base *local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  Relationship *local_298;
  string local_290;
  string *local_270;
  ordered_dict<tinyusdz::Relationship> *local_268;
  _Rb_tree_node_base *local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  if (this == (tinyusdz *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_270 = __return_storage_ptr__;
    ::std::__cxx11::stringstream::stringstream(local_1b8);
    if (*this == (tinyusdz)0x1) {
      pvVar2 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                         ((optional<tinyusdz::Relationship> *)this);
      pvVar3 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                         ((optional<tinyusdz::Relationship> *)this);
      local_2b8._M_dataplus._M_p._0_4_ = pvVar3->listOpQual;
      ::std::__cxx11::string::string
                ((string *)&local_238,"material:binding",(allocator *)&local_258);
      anon_unknown_173::print_relationship
                (&local_290,pvVar2,(ListEditQual *)&local_2b8,SUB81(&local_238,0),
                 (string *)((ulong)mb & 0xffffffff),in_R9D);
      ::std::operator<<(local_1a8,(string *)&local_290);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
    if (this[0x310] == (tinyusdz)0x1) {
      pvVar2 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                         ((optional<tinyusdz::Relationship> *)(this + 0x310));
      pvVar3 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                         ((optional<tinyusdz::Relationship> *)(this + 0x310));
      local_2b8._M_dataplus._M_p._0_4_ = pvVar3->listOpQual;
      ::std::__cxx11::string::string
                ((string *)&local_238,"material:binding:preview",(allocator *)&local_258);
      anon_unknown_173::print_relationship
                (&local_290,pvVar2,(ListEditQual *)&local_2b8,SUB81(&local_238,0),
                 (string *)((ulong)mb & 0xffffffff),in_R9D);
      ::std::operator<<(local_1a8,(string *)&local_290);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
    if (this[0x620] == (tinyusdz)0x1) {
      pvVar2 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                         ((optional<tinyusdz::Relationship> *)(this + 0x620));
      pvVar3 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                         ((optional<tinyusdz::Relationship> *)(this + 0x620));
      local_2b8._M_dataplus._M_p._0_4_ = pvVar3->listOpQual;
      ::std::__cxx11::string::string
                ((string *)&local_238,"material:binding:full",(allocator *)&local_258);
      anon_unknown_173::print_relationship
                (&local_290,pvVar2,(ListEditQual *)&local_2b8,SUB81(&local_238,0),
                 (string *)((ulong)mb & 0xffffffff),in_R9D);
      ::std::operator<<(local_1a8,(string *)&local_290);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
    local_2c0 = (_Rb_tree_node_base *)this;
    for (p_Var4 = *(_Rb_tree_node_base **)(this + 0x948);
        p_Var4 != (_Rb_tree_node_base *)(this + 0x938);
        p_Var4 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var4)) {
      if (p_Var4[1]._M_parent != (_Base_ptr)0x0) {
        ::std::__cxx11::string::string((string *)&local_2b8,":",(allocator *)&local_258);
        ::std::operator+(&local_238,"material:binding",&local_2b8);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_290,&local_238,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var4 + 1));
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        local_2b8._M_dataplus._M_p._0_4_ = *(undefined4 *)&p_Var4[9]._M_left;
        anon_unknown_173::print_relationship
                  ((string *)&local_238,(Relationship *)(p_Var4 + 2),(ListEditQual *)&local_2b8,
                   SUB81((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_290,0),(string *)((ulong)mb & 0xffffffff),in_R9D);
        ::std::operator<<(local_1a8,(string *)&local_238);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
      }
    }
    p_Var4 = *(_Rb_tree_node_base **)((long)local_2c0 + 0x978);
    local_2c0 = (_Rb_tree_node_base *)((long)local_2c0 + 0x968);
    while( true ) {
      __return_storage_ptr__ = local_270;
      if (p_Var4 == local_2c0) break;
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      local_290._M_string_length = 0;
      local_290.field_2._M_local_buf[0] = '\0';
      if (p_Var4[1]._M_parent != (_Base_ptr)0x0) {
        ::std::__cxx11::string::string((string *)&local_2b8,":",(allocator *)&local_258);
        ::std::operator+(&local_238,&local_2b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var4 + 1));
        ::std::__cxx11::string::operator=((string *)&local_290,(string *)&local_238);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
      }
      this_00 = (ordered_dict<tinyusdz::Relationship> *)(p_Var4 + 2);
      lVar5 = 0;
      local_268 = this_00;
      local_260 = p_Var4;
      for (idx = 0; idx < *(ulong *)(p_Var4 + 4); idx = idx + 1) {
        ::std::__cxx11::string::string
                  ((string *)&local_238,
                   (string *)
                   ((long)&(((this_00->_keys).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5))
        ;
        local_298 = (Relationship *)0x0;
        bVar1 = ordered_dict<tinyusdz::Relationship>::at(this_00,idx,&local_298);
        if (bVar1) {
          local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
          local_2b8._M_string_length = 0;
          local_2b8.field_2._M_local_buf[0] = '\0';
          if (local_238._M_string_length == 0) {
            ::std::operator+(&local_258,"material:binding:collection",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_290);
            ::std::__cxx11::string::operator=((string *)&local_2b8,(string *)&local_258);
            ::std::__cxx11::string::_M_dispose();
          }
          else {
            ::std::__cxx11::string::string((string *)&local_1f8,":",&local_2c1);
            ::std::operator+(&local_1d8,"material:binding:collection",&local_1f8);
            ::std::operator+(&local_218,&local_1d8,&local_238);
            ::std::operator+(&local_258,&local_218,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_290);
            ::std::__cxx11::string::operator=((string *)&local_2b8,(string *)&local_258);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            this_00 = local_268;
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          local_218._M_dataplus._M_p._0_4_ = local_298->listOpQual;
          anon_unknown_173::print_relationship
                    ((string *)&local_258,local_298,(ListEditQual *)&local_218,SUB81(&local_2b8,0),
                     (string *)((ulong)mb & 0xffffffff),in_R9D);
          ::std::operator<<(local_1a8,(string *)&local_258);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          p_Var4 = local_260;
        }
        ::std::__cxx11::string::_M_dispose();
        lVar5 = lVar5 + 0x20;
      }
      ::std::__cxx11::string::_M_dispose();
      p_Var4 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var4);
    }
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::stringstream::~stringstream(local_1b8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string print_material_binding(const MaterialBinding *mb, const uint32_t indent) {
  if (!mb) {
    return std::string();
  }

  std::stringstream ss;

  if (mb->materialBinding) {
    ss << print_relationship(mb->materialBinding.value(),
                             mb->materialBinding.value().get_listedit_qual(),
                             /* custom */ false, kMaterialBinding, indent);
  }

  if (mb->materialBindingPreview) {
    ss << print_relationship(
        mb->materialBindingPreview.value(),
        mb->materialBindingPreview.value().get_listedit_qual(),
        /* custom */ false, kMaterialBindingPreview, indent);
  }

  if (mb->materialBindingFull) {
    ss << print_relationship(
        mb->materialBindingFull.value(),
        mb->materialBindingFull.value().get_listedit_qual(),
        /* custom */ false, kMaterialBindingFull, indent);
  }

  // NOTE: matb does not include "material:binding", "material:binding:preview" and "material:binding:full"
  for (const auto &matb : mb->materialBindingMap()) {
    if (matb.first.empty()) {
      // this should not happen
      continue;
    }

    std::string matb_name = kMaterialBinding + std::string(":") + matb.first;

    ss << print_relationship(
        matb.second,
        matb.second.get_listedit_qual(),
        /* custom */ false, matb_name, indent);
    
  }

  // TODO: sort by collection name?
  for (const auto &collection : mb->materialBindingCollectionMap()) {

    std::string purpose_name;
    if (!collection.first.empty()) {
      purpose_name = std::string(":") + collection.first;
    }

    for (size_t i = 0; i < collection.second.size(); i++) {
      std::string coll_name = collection.second.keys()[i];
 
      const Relationship *rel{nullptr};
      if (!collection.second.at(i, &rel)) {
        // this should not happen though.
        continue;
      }

      std::string rel_name;

      if (coll_name.empty()) { 
        rel_name = kMaterialBindingCollection + purpose_name;
      } else {
        rel_name = kMaterialBindingCollection + std::string(":") + coll_name + purpose_name;
      }

      ss << print_relationship(
          *rel,
          rel->get_listedit_qual(),
          /* custom */ false, rel_name, indent);
    }
  }

  return ss.str();
}